

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::on_disk_write_complete(torrent *this,storage_error *error,peer_request *p)

{
  uint uVar1;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  piece_block block;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar4;
  string_view job_name;
  piece_block block_finished;
  undefined1 local_68 [36];
  data_union local_44;
  
  counters::inc_stats_counter(this->m_stats_counters,0xfc,-(long)p->length);
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    block_finished.piece_index.m_val = (p->piece).m_val;
    uVar1 = (((this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_files).m_piece_length;
    uVar4 = 0x4000;
    if (uVar1 < 0x4000) {
      uVar4 = uVar1;
    }
    if ((int)uVar1 < 1) {
      uVar4 = 0x4000;
    }
    block_finished.block_index = p->start / (int)uVar4;
    if ((error->ec).val_ == 0) {
      this_00._M_head_impl =
           (this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
      if (this_00._M_head_impl != (piece_picker *)0x0) {
        block.block_index = block_finished.block_index;
        block.piece_index.m_val = block_finished.piece_index.m_val;
        bVar2 = piece_picker::is_finished(this_00._M_head_impl,block);
        if (!bVar2) {
          piece_picker::mark_as_finished
                    ((this->super_torrent_hot_members).m_picker._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                     block,(torrent_peer *)0x0);
          maybe_done_flushing(this);
          iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          if ((*(uint *)(CONCAT44(extraout_var,iVar3) + 0x68) >> 0x18 & 1) != 0) {
            iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[5])();
            get_handle((torrent *)local_68);
            local_44.base.sa_data[6] = '\0';
            local_44.base.sa_data[7] = '\0';
            local_44.base.sa_data[8] = '\0';
            local_44.base.sa_data[9] = '\0';
            local_44.base.sa_data[10] = '\0';
            local_44.base.sa_data[0xb] = '\0';
            local_44.base.sa_data[0xc] = '\0';
            local_44.base.sa_data[0xd] = '\0';
            local_44._16_8_ = 0;
            local_44.v6.sin6_scope_id = 0;
            local_44._0_8_ = 2;
            digest32<160L>::clear((digest32<160L> *)(local_68 + 0x10));
            alert_manager::
            emplace_alert<libtorrent::block_finished_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::digest32<160l>,int_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                      ((alert_manager *)CONCAT44(extraout_var_00,iVar3),(torrent_handle *)local_68,
                       (basic_endpoint<boost::asio::ip::tcp> *)&local_44.base,
                       (digest32<160L> *)(local_68 + 0x10),&block_finished.block_index,
                       &block_finished.piece_index);
            ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
          }
        }
      }
    }
    else {
      job_name._M_str = "write";
      job_name._M_len = 5;
      handle_disk_error(this,job_name,error,(peer_connection *)0x0,none);
    }
  }
  return;
}

Assistant:

void torrent::on_disk_write_complete(storage_error const& error
		, peer_request const& p) try
	{
		TORRENT_ASSERT(is_single_thread());

		m_stats_counters.inc_stats_counter(counters::queued_write_bytes, -p.length);

//		std::fprintf(stderr, "torrent::on_disk_write_complete ret:%d piece:%d block:%d\n"
//			, j->ret, j->piece, j->offset/0x4000);

		INVARIANT_CHECK;
		if (m_abort) return;
		piece_block const block_finished(p.piece, p.start / block_size());

		if (error)
		{
			handle_disk_error("write", error);
			return;
		}

		if (!has_picker()) return;

		// if we already have this block, just ignore it.
		// this can happen if the same block is passed in through
		// add_piece() multiple times
		if (picker().is_finished(block_finished)) return;

		picker().mark_as_finished(block_finished, nullptr);
		maybe_done_flushing();

		if (alerts().should_post<block_finished_alert>())
		{
			alerts().emplace_alert<block_finished_alert>(get_handle(),
				tcp::endpoint(), peer_id(), block_finished.block_index
				, block_finished.piece_index);
		}
	}
	catch (...) { handle_exception(); }